

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

string * __thiscall
helics::FederateState::processQueryActual_abi_cxx11_
          (string *__return_storage_ptr__,FederateState *this,string_view query)

{
  InterfaceInfo *this_00;
  value_t vVar1;
  InputInfo *pIVar2;
  pointer pGVar3;
  json_value jVar4;
  TimeCoordinator *pTVar5;
  pointer ppVar6;
  TimeRepresentation<count_time<9,_long>_> TVar7;
  pointer ppVar8;
  pointer pfVar9;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  basic_string_view<char,_std::char_traits<char>_> __x_09;
  basic_string_view<char,_std::char_traits<char>_> __x_10;
  basic_string_view<char,_std::char_traits<char>_> __x_11;
  basic_string_view<char,_std::char_traits<char>_> __x_12;
  basic_string_view<char,_std::char_traits<char>_> __x_13;
  basic_string_view<char,_std::char_traits<char>_> __x_14;
  basic_string_view<char,_std::char_traits<char>_> __x_15;
  basic_string_view<char,_std::char_traits<char>_> __x_16;
  basic_string_view<char,_std::char_traits<char>_> __args;
  basic_string_view<char,_std::char_traits<char>_> __x_17;
  bool bVar10;
  int iVar11;
  ostream *poVar12;
  ulong uVar13;
  string *psVar14;
  reference pvVar15;
  long lVar16;
  pointer pcVar17;
  GlobalFederateId *ele;
  object_t *poVar18;
  undefined8 uVar19;
  shared_handle *psVar20;
  function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
  *in_R9;
  char *pcVar21;
  unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *ipt;
  pointer puVar22;
  size_t sVar23;
  GlobalHandle *isrc;
  pointer pGVar24;
  pointer ppVar25;
  const_iterator __begin2;
  pointer pfVar26;
  pointer ppVar27;
  string_view request;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_09;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_10;
  basic_string_view<char,_std::char_traits<char>_> __args_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_11;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_12;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_13;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_14;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_15;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_16;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_17;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_18;
  initializer_list_t init;
  initializer_list_t init_00;
  initializer_list_t init_01;
  initializer_list_t init_02;
  basic_string_view<char,_std::char_traits<char>_> __x_18;
  initializer_list_t init_03;
  initializer_list_t init_04;
  string_view query_local;
  anon_class_8_1_8991fb9c addHeader;
  shared_handle ipts;
  int local_364;
  pointer local_360;
  json json;
  data local_338;
  data local_328;
  data local_318;
  data local_308;
  string qres;
  ostringstream subs;
  data local_160;
  data local_150;
  data local_140;
  data local_130 [2];
  data local_110;
  data local_100;
  data local_f0;
  data local_e0;
  undefined1 local_d0 [16];
  data local_c0;
  data local_b0;
  data local_a0;
  data local_90;
  data local_80;
  key_type local_70;
  key_type local_50;
  
  query_local._M_str = query._M_str;
  query_local._M_len = query._M_len;
  this_00 = &this->interfaceInformation;
  request._M_str = (char *)this_00;
  request._M_len = (size_t)query_local._M_str;
  addHeader.this = this;
  _subs = this;
  generateInterfaceQueryResults
            (&qres,(helics *)query_local._M_len,request,(InterfaceInfo *)&subs,in_R9);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&subs);
  if (qres._M_string_length != 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)qres._M_dataplus._M_p == &qres.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(qres.field_2._M_allocated_capacity._1_7_,qres.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = qres.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = qres._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(qres.field_2._M_allocated_capacity._1_7_,qres.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = qres._M_string_length;
    qres._M_string_length = 0;
    qres.field_2._M_local_buf[0] = '\0';
    qres._M_dataplus._M_p = (pointer)&qres.field_2;
    goto LAB_002ac3d6;
  }
  __x._M_str = query_local._M_str;
  __x._M_len = query_local._M_len;
  __y._M_str = "global_flush";
  __y._M_len = 0xc;
  bVar10 = std::operator==(__x,__y);
  if (bVar10) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"{\"status\":true}",(allocator<char> *)&subs);
    goto LAB_002ac3d6;
  }
  __x_00._M_str = query_local._M_str;
  __x_00._M_len = query_local._M_len;
  __y_00._M_str = "subscriptions";
  __y_00._M_len = 0xd;
  bVar10 = std::operator==(__x_00,__y_00);
  if (bVar10) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&subs);
    std::operator<<((ostream *)&subs,"[");
    gmlc::libguarded::
    shared_guarded<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
    ::lock_shared(&ipts,&(this->interfaceInformation).inputs);
    local_360 = ((ipts.data)->dataStorage).
                super__Vector_base<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar22 = ((ipts.data)->dataStorage).
                   super__Vector_base<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar22 != local_360;
        puVar22 = puVar22 + 1) {
      pIVar2 = (puVar22->_M_t).
               super___uniq_ptr_impl<helics::InputInfo,_std::default_delete<helics::InputInfo>_>.
               _M_t.
               super__Tuple_impl<0UL,_helics::InputInfo_*,_std::default_delete<helics::InputInfo>_>.
               super__Head_base<0UL,_helics::InputInfo_*,_false>._M_head_impl;
      pGVar3 = *(pointer *)
                ((long)&(pIVar2->input_sources).
                        super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                + 8);
      for (pGVar24 = *(pointer *)
                      &(pIVar2->input_sources).
                       super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                       ._M_impl; pGVar24 != pGVar3; pGVar24 = pGVar24 + 1) {
        poVar12 = helics::operator<<((ostream *)&subs,(GlobalFederateId)(pGVar24->fed_id).gid);
        poVar12 = std::operator<<(poVar12,':');
        poVar12 = helics::operator<<(poVar12,(InterfaceHandle)(pGVar24->handle).hid);
        std::operator<<(poVar12,';');
      }
    }
    gmlc::libguarded::
    shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
    ::unlock(&ipts);
    LOCK();
    (this->processing).super___atomic_flag_base._M_i = false;
    UNLOCK();
    std::__cxx11::stringbuf::str();
    if ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] ==
        ';') {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__);
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,']');
    std::shared_lock<std::shared_mutex>::~shared_lock(&ipts.m_handle_lock);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&subs);
    goto LAB_002ac3d6;
  }
  __x_01._M_str = query_local._M_str;
  __x_01._M_len = query_local._M_len;
  __y_01._M_str = "dependencies";
  __y_01._M_len = 0xc;
  bVar10 = std::operator==(__x_01,__y_01);
  if (bVar10) {
    TimeCoordinator::getDependencies
              ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)&json,
               (this->timeCoord)._M_t.
               super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
               .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"[",(allocator<char> *)&subs);
    for (poVar18 = (object_t *)json.m_data._0_8_; poVar18 != json.m_data.m_value.object;
        poVar18 = (object_t *)&(poVar18->_M_t)._M_impl.field_0x4) {
      CLI::std::__cxx11::to_string((string *)&ipts,*(int *)&(poVar18->_M_t)._M_impl);
      generateJsonQuotedString((string *)&subs,(string *)&ipts);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&subs);
      std::__cxx11::string::~string((string *)&subs);
      std::__cxx11::string::~string((string *)&ipts);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__,',');
    }
    uVar13 = __return_storage_ptr__->_M_string_length;
    if (uVar13 < 2) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__,']');
    }
    else {
      pcVar17 = (__return_storage_ptr__->_M_dataplus)._M_p;
LAB_002ac195:
      pcVar17[uVar13 - 1] = ']';
    }
LAB_002ac3c8:
    std::_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::
    ~_Vector_base((_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                   *)&json);
    goto LAB_002ac3d6;
  }
  __x_02._M_str = query_local._M_str;
  __x_02._M_len = query_local._M_len;
  __y_02._M_str = "current_time";
  __y_02._M_len = 0xc;
  bVar10 = std::operator==(__x_02,__y_02);
  if (bVar10) {
    (**(code **)((long)(((this->timeCoord)._M_t.
                         super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                         .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl)->
                       super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator + 0x58))
              (__return_storage_ptr__);
    goto LAB_002ac3d6;
  }
  __x_03._M_str = query_local._M_str;
  __x_03._M_len = query_local._M_len;
  __y_03._M_str = "current_state";
  __y_03._M_len = 0xd;
  bVar10 = std::operator==(__x_03,__y_03);
  if (bVar10) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&subs,(nullptr_t)0x0);
    processQueryActual::anon_class_8_1_8991fb9c::operator()(&addHeader,(json *)&subs);
    psVar14 = fedStateString_abi_cxx11_((this->state)._M_i);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::
    basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_80,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar14);
    pvVar15 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          *)&subs,"state");
    vVar1 = (pvVar15->m_data).m_type;
    (pvVar15->m_data).m_type = local_80.m_type;
    jVar4 = (pvVar15->m_data).m_value;
    (pvVar15->m_data).m_value = local_80.m_value;
    local_80.m_type = vVar1;
    local_80.m_value = jVar4;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_80);
    iVar11 = publicationCount(this);
    ipts.data = (pointer)CONCAT44(ipts.data._4_4_,iVar11);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json<int,_int,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_90,(int *)&ipts);
    pvVar15 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          *)&subs,"publications");
    vVar1 = (pvVar15->m_data).m_type;
    (pvVar15->m_data).m_type = local_90.m_type;
    jVar4 = (pvVar15->m_data).m_value;
    (pvVar15->m_data).m_value = local_90.m_value;
    local_90.m_type = vVar1;
    local_90.m_value = jVar4;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_90);
    iVar11 = inputCount(this);
    ipts.data = (pointer)CONCAT44(ipts.data._4_4_,iVar11);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json<int,_int,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_a0,(int *)&ipts);
    pvVar15 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          *)&subs,"input");
    vVar1 = (pvVar15->m_data).m_type;
    (pvVar15->m_data).m_type = local_a0.m_type;
    jVar4 = (pvVar15->m_data).m_value;
    (pvVar15->m_data).m_value = local_a0.m_value;
    local_a0.m_type = vVar1;
    local_a0.m_value = jVar4;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_a0);
    iVar11 = endpointCount(this);
    ipts.data = (pointer)CONCAT44(ipts.data._4_4_,iVar11);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json<int,_int,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_b0,(int *)&ipts);
    pvVar15 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          *)&subs,"endpoints");
    vVar1 = (pvVar15->m_data).m_type;
    (pvVar15->m_data).m_type = local_b0.m_type;
    jVar4 = (pvVar15->m_data).m_value;
    (pvVar15->m_data).m_value = local_b0.m_value;
    local_b0.m_type = vVar1;
    local_b0.m_value = jVar4;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_b0);
    lVar16 = (this->time_granted).internalTimeCode;
    ipts.data = (pointer)((double)(lVar16 % 1000000000) * 1e-09 + (double)(lVar16 / 1000000000));
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json<double,_double,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_c0,(double *)&ipts);
    pvVar15 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          *)&subs,"granted_time");
    vVar1 = (pvVar15->m_data).m_type;
    (pvVar15->m_data).m_type = local_c0.m_type;
    jVar4 = (pvVar15->m_data).m_value;
    (pvVar15->m_data).m_value = local_c0.m_value;
    local_c0.m_type = vVar1;
    local_c0.m_value = jVar4;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_c0);
    fileops::generateJsonString(__return_storage_ptr__,(json *)&subs,true);
LAB_002ac86d:
    psVar20 = (shared_handle *)&subs;
  }
  else {
    __x_04._M_str = query_local._M_str;
    __x_04._M_len = query_local._M_len;
    __y_04._M_str = "barriers";
    __y_04._M_len = 8;
    bVar10 = std::operator==(__x_04,__y_04);
    if (bVar10) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&subs,(nullptr_t)0x0);
      processQueryActual::anon_class_8_1_8991fb9c::operator()(&addHeader,(json *)&subs);
      init._M_len = 0;
      init._M_array = (iterator)local_d0;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::array(init);
      pvVar15 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)&subs,"barriers");
      vVar1 = (pvVar15->m_data).m_type;
      (pvVar15->m_data).m_type = local_d0[0];
      jVar4 = (pvVar15->m_data).m_value;
      (pvVar15->m_data).m_value = (json_value)local_d0._8_8_;
      local_d0[0] = vVar1;
      local_d0._8_8_ = jVar4;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)local_d0);
      pTVar5 = (this->timeCoord)._M_t.
               super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
               .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
      ppVar6 = *(pointer *)
                ((long)&(pTVar5->timeBlocks).
                        super__Vector_base<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
                + 8);
      for (ppVar25 = *(pointer *)
                      &(pTVar5->timeBlocks).
                       super__Vector_base<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
                       ._M_impl; ppVar25 != ppVar6; ppVar25 = ppVar25 + 1) {
        init_00._M_len = 0;
        init_00._M_array = (iterator)&ipts;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::object(init_00);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json<const_int_&,_int,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_308,&ppVar25->second);
        pvVar15 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&ipts,"id");
        vVar1 = (pvVar15->m_data).m_type;
        (pvVar15->m_data).m_type = local_308.m_type;
        jVar4 = (pvVar15->m_data).m_value;
        (pvVar15->m_data).m_value = local_308.m_value;
        local_308.m_type = vVar1;
        local_308.m_value = jVar4;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_308);
        TVar7.internalTimeCode = (ppVar25->first).internalTimeCode;
        json.m_data._0_8_ =
             (double)(TVar7.internalTimeCode % 1000000000) * 1e-09 +
             (double)(TVar7.internalTimeCode / 1000000000);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json<double,_double,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_318,(double *)&json);
        pvVar15 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&ipts,"time");
        vVar1 = (pvVar15->m_data).m_type;
        (pvVar15->m_data).m_type = local_318.m_type;
        jVar4 = (pvVar15->m_data).m_value;
        (pvVar15->m_data).m_value = local_318.m_value;
        local_318.m_type = vVar1;
        local_318.m_value = jVar4;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_318);
        pvVar15 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&subs,"barriers");
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::push_back(pvVar15,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)&ipts);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)&ipts);
      }
      fileops::generateJsonString(__return_storage_ptr__,(json *)&subs,true);
      goto LAB_002ac86d;
    }
    __x_05._M_str = query_local._M_str;
    __x_05._M_len = query_local._M_len;
    __y_05._M_str = "global_state";
    __y_05._M_len = 0xc;
    bVar10 = std::operator==(__x_05,__y_05);
    if (bVar10) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&subs,(nullptr_t)0x0);
      processQueryActual::anon_class_8_1_8991fb9c::operator()(&addHeader,(json *)&subs);
      psVar14 = fedStateString_abi_cxx11_((this->state)._M_i);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar14);
      pvVar15 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)&subs,"state");
      vVar1 = (pvVar15->m_data).m_type;
      (pvVar15->m_data).m_type = local_e0.m_type;
      jVar4 = (pvVar15->m_data).m_value;
      (pvVar15->m_data).m_value = local_e0.m_value;
      local_e0.m_type = vVar1;
      local_e0.m_value = jVar4;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_e0);
      fileops::generateJsonString(__return_storage_ptr__,(json *)&subs,true);
      goto LAB_002ac86d;
    }
    __x_06._M_str = query_local._M_str;
    __x_06._M_len = query_local._M_len;
    __y_06._M_str = "global_time_debugging";
    __y_06._M_len = 0x15;
    bVar10 = std::operator==(__x_06,__y_06);
    if (bVar10) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&subs,(nullptr_t)0x0);
      processQueryActual::anon_class_8_1_8991fb9c::operator()(&addHeader,(json *)&subs);
      psVar14 = fedStateString_abi_cxx11_((this->state)._M_i);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar14);
      pvVar15 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)&subs,"federate_state");
      vVar1 = (pvVar15->m_data).m_type;
      (pvVar15->m_data).m_type = local_f0.m_type;
      jVar4 = (pvVar15->m_data).m_value;
      (pvVar15->m_data).m_value = local_f0.m_value;
      local_f0.m_type = vVar1;
      local_f0.m_value = jVar4;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_f0);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json<const_bool_&,_bool,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_100,&this->timeGranted_mode);
      pvVar15 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)&subs,"granted_mode");
      vVar1 = (pvVar15->m_data).m_type;
      (pvVar15->m_data).m_type = local_100.m_type;
      jVar4 = (pvVar15->m_data).m_value;
      (pvVar15->m_data).m_value = local_100.m_value;
      local_100.m_type = vVar1;
      local_100.m_value = jVar4;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_100);
      pTVar5 = (this->timeCoord)._M_t.
               super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
               .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
      if (*(pointer *)
           &(pTVar5->super_BaseTimeCoordinator).dependencies.dependencies.
            super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> !=
          *(pointer *)((long)&(pTVar5->super_BaseTimeCoordinator).dependencies + 8)) {
        (**(code **)((long)(pTVar5->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator + 0x60))
                  (pTVar5,&subs);
      }
      fileops::generateJsonString(__return_storage_ptr__,(json *)&subs,true);
      goto LAB_002ac86d;
    }
    __x_07._M_str = query_local._M_str;
    __x_07._M_len = query_local._M_len;
    __y_07._M_str = "timeconfig";
    __y_07._M_len = 10;
    bVar10 = std::operator==(__x_07,__y_07);
    if (bVar10) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&subs,(nullptr_t)0x0);
      TimeCoordinator::generateConfig
                ((this->timeCoord)._M_t.
                 super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                 .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl,(json *)&subs
                );
      generateConfig(this,(json *)&subs);
      fileops::generateJsonString(__return_storage_ptr__,(json *)&subs,true);
      goto LAB_002ac86d;
    }
    __x_08._M_str = query_local._M_str;
    __x_08._M_len = query_local._M_len;
    __y_08._M_str = "config";
    __y_08._M_len = 6;
    bVar10 = std::operator==(__x_08,__y_08);
    if (bVar10) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&subs,(nullptr_t)0x0);
      TimeCoordinator::generateConfig
                ((this->timeCoord)._M_t.
                 super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                 .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl,(json *)&subs
                );
      generateConfig(this,(json *)&subs);
      InterfaceInfo::generateInferfaceConfig(this_00,(json *)&subs);
      addFederateTags((json *)&subs,this);
      fileops::generateJsonString(__return_storage_ptr__,(json *)&subs,true);
      goto LAB_002ac86d;
    }
    __x_09._M_str = query_local._M_str;
    __x_09._M_len = query_local._M_len;
    __y_09._M_str = "unconnected_interfaces";
    __y_09._M_len = 0x16;
    bVar10 = std::operator==(__x_09,__y_09);
    if (!bVar10) {
      __x_10._M_str = query_local._M_str;
      __x_10._M_len = query_local._M_len;
      __y_10._M_str = "tags";
      __y_10._M_len = 4;
      bVar10 = std::operator==(__x_10,__y_10);
      if (bVar10) {
        init_02._M_len = 0;
        init_02._M_array = (iterator)&subs;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::object(init_02);
        ppVar8 = (this->tags).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (ppVar27 = (this->tags).
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppVar27 != ppVar8;
            ppVar27 = ppVar27 + 1) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_338,&ppVar27->second);
          std::__cxx11::string::string((string *)&local_70,&ppVar27->first);
          pvVar15 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)&subs,&local_70);
          vVar1 = (pvVar15->m_data).m_type;
          (pvVar15->m_data).m_type = local_338.m_type;
          jVar4 = (pvVar15->m_data).m_value;
          (pvVar15->m_data).m_value = local_338.m_value;
          local_338.m_type = vVar1;
          local_338.m_value = jVar4;
          std::__cxx11::string::~string((string *)&local_70);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_338);
        }
        fileops::generateJsonString(__return_storage_ptr__,(json *)&subs,true);
        goto LAB_002acce3;
      }
      iVar11 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                         (&query_local,0,4,"tag/");
      __x_11._M_str = query_local._M_str;
      __x_11._M_len = query_local._M_len;
      if (iVar11 == 0) {
        pcVar21 = query_local._M_str + 4;
        sVar23 = query_local._M_len - 4;
        ppVar8 = (this->tags).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (ppVar27 = (this->tags).
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppVar27 != ppVar8;
            ppVar27 = ppVar27 + 1) {
          __y_12._M_str = (ppVar27->first)._M_dataplus._M_p;
          __y_12._M_len = (ppVar27->first)._M_string_length;
          __x_18._M_str = pcVar21;
          __x_18._M_len = sVar23;
          bVar10 = std::operator==(__x_18,__y_12);
          if (bVar10) {
            generateJsonQuotedString(__return_storage_ptr__,(string *)&ppVar27->second);
            goto LAB_002ac3d6;
          }
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"\"\"",(allocator<char> *)&subs);
        goto LAB_002ac3d6;
      }
      __y_11._M_str = "dependents";
      __y_11._M_len = 10;
      bVar10 = std::operator==(__x_11,__y_11);
      if (bVar10) {
        TimeCoordinator::getDependents
                  ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                   &json,(this->timeCoord)._M_t.
                         super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                         .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"[",(allocator<char> *)&subs);
        for (poVar18 = (object_t *)json.m_data._0_8_; poVar18 != json.m_data.m_value.object;
            poVar18 = (object_t *)&(poVar18->_M_t)._M_impl.field_0x4) {
          CLI::std::__cxx11::to_string((string *)&ipts,*(int *)&(poVar18->_M_t)._M_impl);
          generateJsonQuotedString((string *)&subs,(string *)&ipts);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&subs);
          std::__cxx11::string::~string((string *)&subs);
          std::__cxx11::string::~string((string *)&ipts);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,',');
        }
        uVar13 = __return_storage_ptr__->_M_string_length;
        if (1 < uVar13) {
          pcVar17 = (__return_storage_ptr__->_M_dataplus)._M_p;
          goto LAB_002ac195;
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,']');
        goto LAB_002ac3c8;
      }
      __x_12._M_str = query_local._M_str;
      __x_12._M_len = query_local._M_len;
      __y_13._M_str = "logs";
      __y_13._M_len = 4;
      bVar10 = std::operator==(__x_12,__y_13);
      if (bVar10) {
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&subs,(nullptr_t)0x0);
        processQueryActual::anon_class_8_1_8991fb9c::operator()(&addHeader,(json *)&subs);
        bufferToJson(&((this->mLogManager)._M_t.
                       super___uniq_ptr_impl<helics::LogManager,_std::default_delete<helics::LogManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::LogManager_*,_std::default_delete<helics::LogManager>_>
                       .super__Head_base<0UL,_helics::LogManager_*,_false>._M_head_impl)->mLogBuffer
                     ,(json *)&subs);
        fileops::generateJsonString(__return_storage_ptr__,(json *)&subs,true);
LAB_002acce3:
        psVar20 = (shared_handle *)&subs;
      }
      else {
        __x_13._M_str = query_local._M_str;
        __x_13._M_len = query_local._M_len;
        __y_14._M_str = "data_flow_graph";
        __y_14._M_len = 0xf;
        bVar10 = std::operator==(__x_13,__y_14);
        if (bVar10) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&subs,(nullptr_t)0x0);
          processQueryActual::anon_class_8_1_8991fb9c::operator()(&addHeader,(json *)&subs);
          InterfaceInfo::generateDataFlowGraph(this_00,(json *)&subs);
          fileops::generateJsonString(__return_storage_ptr__,(json *)&subs,true);
          goto LAB_002acce3;
        }
        __x_14._M_str = query_local._M_str;
        __x_14._M_len = query_local._M_len;
        __y_15._M_str = "global_time";
        __y_15._M_len = 0xb;
        bVar10 = std::operator==(__x_14,__y_15);
        if ((bVar10) ||
           (__x_15._M_str = query_local._M_str, __x_15._M_len = query_local._M_len,
           __y_16._M_str = "global_status", __y_16._M_len = 0xd,
           bVar10 = std::operator==(__x_15,__y_16), bVar10)) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&subs,(nullptr_t)0x0);
          processQueryActual::anon_class_8_1_8991fb9c::operator()(&addHeader,(json *)&subs);
          lVar16 = (((this->timeCoord)._M_t.
                     super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                     .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl)->
                   time_granted).internalTimeCode;
          ipts.data = (pointer)((double)(lVar16 % 1000000000) * 1e-09 +
                               (double)(lVar16 / 1000000000));
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json<double,_double,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)local_130,(double *)&ipts);
          pvVar15 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)&subs,"granted_time");
          vVar1 = (pvVar15->m_data).m_type;
          (pvVar15->m_data).m_type = local_130[0].m_type;
          jVar4 = (pvVar15->m_data).m_value;
          (pvVar15->m_data).m_value = local_130[0].m_value;
          local_130[0].m_type = vVar1;
          local_130[0].m_value = jVar4;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(local_130);
          pTVar5 = (this->timeCoord)._M_t.
                   super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                   .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
          lVar16 = (pTVar5->info).outputDelay.internalTimeCode +
                   (pTVar5->time_granted).internalTimeCode;
          ipts.data = (pointer)((double)(lVar16 % 1000000000) * 1e-09 +
                               (double)(lVar16 / 1000000000));
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json<double,_double,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_140,(double *)&ipts);
          pvVar15 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)&subs,"send_time");
          vVar1 = (pvVar15->m_data).m_type;
          (pvVar15->m_data).m_type = local_140.m_type;
          jVar4 = (pvVar15->m_data).m_value;
          (pvVar15->m_data).m_value = local_140.m_value;
          local_140.m_type = vVar1;
          local_140.m_value = jVar4;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_140);
          fileops::generateJsonString(__return_storage_ptr__,(json *)&subs,true);
          goto LAB_002acce3;
        }
        __x_16._M_str = query_local._M_str;
        __x_16._M_len = query_local._M_len;
        __y_17._M_str = "dependency_graph";
        __y_17._M_len = 0x10;
        bVar10 = std::operator==(__x_16,__y_17);
        if (!bVar10) {
          pfVar26 = (this->queryCallbacks).
                    super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pfVar9 = (this->queryCallbacks).
                   super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pfVar26 != pfVar9) {
            for (; pfVar26 != pfVar9; pfVar26 = pfVar26 + 1) {
              if ((pfVar26->super__Function_base)._M_manager != (_Manager_type)0x0) {
                __args._M_str = query_local._M_str;
                __args._M_len = query_local._M_len;
                std::
                function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
                ::operator()(__return_storage_ptr__,pfVar26,__args);
                if (__return_storage_ptr__->_M_string_length != 0) goto LAB_002ac3d6;
                std::__cxx11::string::~string((string *)__return_storage_ptr__);
              }
            }
          }
          ppVar8 = (this->tags).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (ppVar27 = (this->tags).
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; ppVar27 != ppVar8;
              ppVar27 = ppVar27 + 1) {
            __x_17._M_str = query_local._M_str;
            __x_17._M_len = query_local._M_len;
            __y_18._M_str = (ppVar27->first)._M_dataplus._M_p;
            __y_18._M_len = (ppVar27->first)._M_string_length;
            bVar10 = std::operator==(__x_17,__y_18);
            if (bVar10) {
              generateJsonQuotedString(__return_storage_ptr__,(string *)&ppVar27->second);
              goto LAB_002ac3d6;
            }
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&subs,"unrecognized Federate query",(allocator<char> *)&ipts);
          generateJsonErrorResponse(__return_storage_ptr__,BAD_REQUEST,(string *)&subs);
          std::__cxx11::string::~string((string *)&subs);
          goto LAB_002ac3d6;
        }
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&ipts,(nullptr_t)0x0);
        processQueryActual::anon_class_8_1_8991fb9c::operator()(&addHeader,(json *)&ipts);
        init_03._M_len = 0;
        init_03._M_array = (iterator)&local_150;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::array(init_03);
        pvVar15 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&ipts,"dependents");
        vVar1 = (pvVar15->m_data).m_type;
        (pvVar15->m_data).m_type = local_150.m_type;
        jVar4 = (pvVar15->m_data).m_value;
        (pvVar15->m_data).m_value = local_150.m_value;
        local_150.m_type = vVar1;
        local_150.m_value = jVar4;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_150);
        TimeCoordinator::getDependents
                  ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                   &subs,(this->timeCoord)._M_t.
                         super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                         .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl);
        for (uVar19 = _subs; (FederateState *)uVar19 != (FederateState *)0x0;
            uVar19 = (long)&(((FederateState *)uVar19)->name)._M_dataplus._M_p + 4) {
          pvVar15 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)&ipts,"dependents");
          local_364 = *(int *)&(((FederateState *)uVar19)->name)._M_dataplus._M_p;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json<int,_int,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&json.m_data,&local_364);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::push_back(pvVar15,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)&json.m_data);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&json.m_data);
        }
        std::_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::
        ~_Vector_base((_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                       *)&subs);
        init_04._M_len = 0;
        init_04._M_array = (iterator)&local_160;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::array(init_04);
        pvVar15 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&ipts,"dependencies");
        vVar1 = (pvVar15->m_data).m_type;
        (pvVar15->m_data).m_type = local_160.m_type;
        jVar4 = (pvVar15->m_data).m_value;
        (pvVar15->m_data).m_value = local_160.m_value;
        local_160.m_type = vVar1;
        local_160.m_value = jVar4;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_160);
        TimeCoordinator::getDependencies
                  ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                   &subs,(this->timeCoord)._M_t.
                         super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                         .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl);
        for (uVar19 = _subs; (FederateState *)uVar19 != (FederateState *)0x0;
            uVar19 = (long)&(((FederateState *)uVar19)->name)._M_dataplus._M_p + 4) {
          pvVar15 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)&ipts,"dependencies");
          local_364 = *(int *)&(((FederateState *)uVar19)->name)._M_dataplus._M_p;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json<int,_int,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&json.m_data,&local_364);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::push_back(pvVar15,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)&json.m_data);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&json.m_data);
        }
        std::_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::
        ~_Vector_base((_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                       *)&subs);
        fileops::generateJsonString(__return_storage_ptr__,(json *)&ipts,true);
        psVar20 = &ipts;
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)psVar20);
      goto LAB_002ac3d6;
    }
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&ipts,(nullptr_t)0x0);
    processQueryActual::anon_class_8_1_8991fb9c::operator()(&addHeader,(json *)&ipts);
    InterfaceInfo::getUnconnectedInterfaces(this_00,(json *)&ipts);
    if ((this->tags).
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->tags).
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      init_01._M_len = 0;
      init_01._M_array = (iterator)&subs;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::object(init_01);
      ppVar8 = (this->tags).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar27 = (this->tags).
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppVar27 != ppVar8;
          ppVar27 = ppVar27 + 1) {
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_328,&ppVar27->second);
        std::__cxx11::string::string((string *)&local_50,&ppVar27->first);
        pvVar15 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)&subs,&local_50);
        vVar1 = (pvVar15->m_data).m_type;
        (pvVar15->m_data).m_type = local_328.m_type;
        jVar4 = (pvVar15->m_data).m_value;
        (pvVar15->m_data).m_value = local_328.m_value;
        local_328.m_type = vVar1;
        local_328.m_value = jVar4;
        std::__cxx11::string::~string((string *)&local_50);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_328);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_110,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&subs);
      pvVar15 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)&ipts,"tags");
      vVar1 = (pvVar15->m_data).m_type;
      (pvVar15->m_data).m_type = local_110.m_type;
      jVar4 = (pvVar15->m_data).m_value;
      (pvVar15->m_data).m_value = local_110.m_value;
      local_110.m_type = vVar1;
      local_110.m_value = jVar4;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_110);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&subs);
    }
    pfVar26 = (this->queryCallbacks).
              super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pfVar9 = (this->queryCallbacks).
             super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pfVar26 != pfVar9) {
      for (; pfVar26 != pfVar9; pfVar26 = pfVar26 + 1) {
        if ((pfVar26->super__Function_base)._M_manager != (_Manager_type)0x0) {
          __args_00._M_str = "potential_interfaces";
          __args_00._M_len = 0x14;
          std::
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
          ::operator()((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&subs,
                       pfVar26,__args_00);
          std::__cxx11::string::~string((string *)&subs);
        }
      }
    }
    fileops::generateJsonString(__return_storage_ptr__,(json *)&ipts,true);
    psVar20 = &ipts;
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data((data *)psVar20);
LAB_002ac3d6:
  std::__cxx11::string::~string((string *)&qres);
  return __return_storage_ptr__;
}

Assistant:

std::string FederateState::processQueryActual(std::string_view query) const
{
    auto addHeader = [this](nlohmann::json& base) {
        nlohmann::json att = nlohmann::json::object();
        att["name"] = getIdentifier();
        att["id"] = global_id.load().baseValue();
        att["parent"] = mParent->getGlobalId().baseValue();
        base["attributes"] = att;
    };

    auto qres = generateInterfaceQueryResults(query, interfaceInformation, addHeader);
    if (!qres.empty()) {
        return qres;
    }
    if (query == "global_flush") {
        return "{\"status\":true}";
    }
    if (query == "subscriptions") {
        std::ostringstream subs;
        subs << "[";
        auto ipts = interfaceInformation.getInputs();
        for (const auto& ipt : ipts) {
            for (const auto& isrc : ipt->input_sources) {
                subs << isrc.fed_id << ':' << isrc.handle << ';';
            }
        }
        ipts.unlock();
        unlock();
        auto str = subs.str();
        if (str.back() == ';') {
            str.pop_back();
        }
        str.push_back(']');
        return str;
    }
    if (query == "dependencies") {
        return generateStringVector(timeCoord->getDependencies(),
                                    [](auto& dep) { return std::to_string(dep.baseValue()); });
    }
    if (query == "current_time") {
        return timeCoord->printTimeStatus();
    }
    if (query == "current_state") {
        nlohmann::json base;
        addHeader(base);
        base["state"] = fedStateString(state.load());
        base["publications"] = publicationCount();
        base["input"] = inputCount();
        base["endpoints"] = endpointCount();
        base["granted_time"] = static_cast<double>(grantedTime());
        return fileops::generateJsonString(base);
    }
    if (query == "barriers") {
        nlohmann::json base;
        addHeader(base);

        base["barriers"] = nlohmann::json::array();
        for (const auto& barrier : timeCoord->getBarriers()) {
            nlohmann::json br1 = nlohmann::json::object();
            br1["id"] = barrier.second;
            br1["time"] = static_cast<double>(barrier.first);
            base["barriers"].push_back(std::move(br1));
        }
        return fileops::generateJsonString(base);
    }
    if (query == "global_state") {
        nlohmann::json base;
        addHeader(base);
        base["state"] = fedStateString(state.load());
        return fileops::generateJsonString(base);
    }
    if (query == "global_time_debugging") {
        nlohmann::json base;
        addHeader(base);
        base["federate_state"] = fedStateString(state.load());
        base["granted_mode"] = timeGranted_mode;
        if (!timeCoord->empty()) {
            timeCoord->generateDebuggingTimeInfo(base);
        }
        return fileops::generateJsonString(base);
    }
    if (query == "timeconfig") {
        nlohmann::json base;
        timeCoord->generateConfig(base);
        generateConfig(base);
        return fileops::generateJsonString(base);
    }
    if (query == "config") {
        nlohmann::json base;
        timeCoord->generateConfig(base);
        generateConfig(base);
        interfaceInformation.generateInferfaceConfig(base);
        addFederateTags(base, this);
        return fileops::generateJsonString(base);
    }
    if (query == "unconnected_interfaces") {
        nlohmann::json base;
        addHeader(base);
        interfaceInformation.getUnconnectedInterfaces(base);

        if (!tags.empty()) {
            nlohmann::json tagBlock = nlohmann::json::object();
            for (const auto& tag : tags) {
                tagBlock[tag.first] = tag.second;
            }
            base["tags"] = tagBlock;
        }
        if (!queryCallbacks.empty()) {
            for (const auto& queryCallback : queryCallbacks) {
                if (!queryCallback) {
                    continue;
                }
                auto potential = queryCallback("potential_interfaces");
                if (!potential.empty()) {
                    try {
                        auto json = fileops::loadJsonStr(potential);

                        if (!json.contains("error")) {
                            base["potential_interfaces"] = json;
                            break;
                        }
                    }
                    catch (const std::invalid_argument&) {
                        ;
                    }
                }
            }
        }
        return fileops::generateJsonString(base);
    }
    if (query == "tags") {
        nlohmann::json tagBlock = nlohmann::json::object();
        for (const auto& tag : tags) {
            tagBlock[tag.first] = tag.second;
        }
        return fileops::generateJsonString(tagBlock);
    }
    if (query.compare(0, 4, "tag/") == 0) {
        std::string_view keyTag = query;
        keyTag.remove_prefix(4);
        for (const auto& tag : tags) {
            if (keyTag == tag.first) {
                return generateJsonQuotedString(tag.second);
            }
        }
        return "\"\"";
    }
    if (query == "dependents") {
        return generateStringVector(timeCoord->getDependents(),
                                    [](auto& dep) { return std::to_string(dep.baseValue()); });
    }
    if (query == "logs") {
        nlohmann::json base;
        addHeader(base);
        bufferToJson(mLogManager->getLogBuffer(), base);
        return fileops::generateJsonString(base);
    }
    if (query == "data_flow_graph") {
        nlohmann::json base;
        addHeader(base);
        interfaceInformation.generateDataFlowGraph(base);
        return fileops::generateJsonString(base);
    }
    if (query == "global_time" || query == "global_status") {
        nlohmann::json base;
        addHeader(base);
        base["granted_time"] = static_cast<double>(timeCoord->getGrantedTime());
        base["send_time"] = static_cast<double>(timeCoord->allowedSendTime());
        return fileops::generateJsonString(base);
    }
    if (query == "dependency_graph") {
        nlohmann::json base;
        addHeader(base);
        base["dependents"] = nlohmann::json::array();
        for (auto& dep : timeCoord->getDependents()) {
            base["dependents"].push_back(dep.baseValue());
        }
        base["dependencies"] = nlohmann::json::array();
        for (auto& dep : timeCoord->getDependencies()) {
            base["dependencies"].push_back(dep.baseValue());
        }
        return fileops::generateJsonString(base);
    }

    if (!queryCallbacks.empty()) {
        for (const auto& queryCallback : queryCallbacks) {
            if (!queryCallback) {
                continue;
            }
            auto val = queryCallback(query);
            if (!val.empty()) {
                return val;
            }
        }
    }
    // check existingTag value for a matching string
    for (const auto& tag : tags) {
        if (tag.first == query) {
            return generateJsonQuotedString(tag.second);
        }
    }
    return generateJsonErrorResponse(JsonErrorCodes::BAD_REQUEST, "unrecognized Federate query");
}